

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasm.c
# Opt level: O0

uchar * SnapshotDicoInsert(char *symbol_name,int ptr,int *retidx)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  int local_2c;
  int symbol_len;
  int *retidx_local;
  int ptr_local;
  char *symbol_name_local;
  
  if (retidx == (int *)0x0) {
    if (SnapshotDicoInsert::subchunksize < SnapshotDicoInsert::idx + 0x10000) {
      SnapshotDicoInsert::subchunksize = SnapshotDicoInsert::subchunksize + 0x10000;
      SnapshotDicoInsert::subchunk =
           (uchar *)realloc(SnapshotDicoInsert::subchunk,(long)SnapshotDicoInsert::subchunksize);
    }
    sVar2 = strlen(symbol_name);
    local_2c = (int)sVar2;
    if (0xff < local_2c) {
      local_2c = 0xff;
    }
    lVar3 = (long)SnapshotDicoInsert::idx;
    SnapshotDicoInsert::idx = SnapshotDicoInsert::idx + 1;
    SnapshotDicoInsert::subchunk[lVar3] = (uchar)local_2c;
    memcpy(SnapshotDicoInsert::subchunk + SnapshotDicoInsert::idx,symbol_name,(long)local_2c);
    SnapshotDicoInsert::idx = local_2c + SnapshotDicoInsert::idx;
    memset(SnapshotDicoInsert::subchunk + SnapshotDicoInsert::idx,0,6);
    iVar1 = SnapshotDicoInsert::idx + 6;
    SnapshotDicoInsert::idx = SnapshotDicoInsert::idx + 7;
    SnapshotDicoInsert::subchunk[iVar1] = (uchar)((ulong)(ptr & 0xff00) / 0x100);
    lVar3 = (long)SnapshotDicoInsert::idx;
    SnapshotDicoInsert::idx = SnapshotDicoInsert::idx + 1;
    SnapshotDicoInsert::subchunk[lVar3] = (uchar)ptr;
    symbol_name_local = (char *)0x0;
  }
  else {
    if (symbol_name != (char *)0x0) {
      iVar1 = strcmp(symbol_name,"FREE");
      if (iVar1 == 0) {
        SnapshotDicoInsert::subchunksize = 0;
        SnapshotDicoInsert::idx = 0;
        free(SnapshotDicoInsert::subchunk);
        SnapshotDicoInsert::subchunk = (uchar *)0x0;
      }
    }
    *retidx = SnapshotDicoInsert::idx;
    symbol_name_local = (char *)SnapshotDicoInsert::subchunk;
  }
  return (uchar *)symbol_name_local;
}

Assistant:

unsigned char *SnapshotDicoInsert(char *symbol_name, int ptr, int *retidx)
{
	static unsigned char *subchunk=NULL;
	static int subchunksize=0;
	static int idx=0;
	int symbol_len;
	
	if (retidx) {
		if (symbol_name && strcmp(symbol_name,"FREE")==0) {
			subchunksize=0;
			idx=0;
			MemFree(subchunk);
			subchunk=NULL;
		}
		*retidx=idx;
		return subchunk;
	}
	
	if (idx+65536>subchunksize) {
		subchunksize=subchunksize+65536;
		subchunk=MemRealloc(subchunk,subchunksize);
	}
	
	symbol_len=strlen(symbol_name);
	if (symbol_len>255) symbol_len=255;
	subchunk[idx++]=symbol_len;
	memcpy(subchunk+idx,symbol_name,symbol_len);
	idx+=symbol_len;
	memset(subchunk+idx,0,6);
	idx+=6;
	subchunk[idx++]=(ptr&0xFF00)/256;
	subchunk[idx++]=ptr&0xFF;
	return NULL;
}